

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExceptionOperators.cpp
# Opt level: O1

uint64 Js::JavascriptExceptionOperators::GetStackTraceLimit
                 (Var thrownObject,ScriptContext *scriptContext)

{
  RuntimeFunction *instance;
  code *pcVar1;
  Var pvVar2;
  bool bVar3;
  HRESULT HVar4;
  BOOL BVar5;
  uint32 uVar6;
  RecyclableObject *pRVar7;
  undefined4 *puVar8;
  uint64 uVar9;
  Type TVar10;
  ulong uVar11;
  DisableImplicitFlags DVar12;
  double value;
  Var local_40;
  Var var;
  
  if ((((scriptContext->config).threadConfig)->m_errorStackTrace != true) ||
     (bVar3 = IsErrorInstance(thrownObject), !bVar3)) {
    return 0;
  }
  pRVar7 = VarTo<Js::RecyclableObject>(thrownObject);
  HVar4 = JavascriptError::GetRuntimeError(pRVar7,(LPCWSTR *)0x0);
  instance = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
             super_JavascriptLibraryBase).errorConstructor.ptr;
  DVar12 = scriptContext->threadContext->disableImplicitFlags;
  if (HVar4 == -0x7ff5ffe4) {
    scriptContext->threadContext->disableImplicitFlags = DisableImplicitCallAndExceptionFlag;
  }
  local_40 = (Var)0x0;
  BVar5 = JavascriptOperators::GetPropertyNoCache
                    ((RecyclableObject *)instance,0x162,&local_40,scriptContext);
  pvVar2 = local_40;
  if (BVar5 != 0) {
    if (local_40 == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                         ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_00aa24d0;
      *puVar8 = 0;
    }
    var._0_4_ = HVar4;
    var._7_1_ = DVar12;
    if (((ulong)pvVar2 & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)pvVar2 & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                         ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                         "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar3) goto LAB_00aa24d0;
      *puVar8 = 0;
    }
    TVar10 = TypeIds_FirstNumberType;
    if ((((ulong)pvVar2 & 0xffff000000000000) != 0x1000000000000) &&
       (TVar10 = TypeIds_Number, (ulong)pvVar2 >> 0x32 == 0)) {
      pRVar7 = UnsafeVarTo<Js::RecyclableObject>(pvVar2);
      if (pRVar7 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                           ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar3) goto LAB_00aa24d0;
        *puVar8 = 0;
      }
      TVar10 = ((pRVar7->type).ptr)->typeId;
      if ((0x57 < (int)TVar10) && (BVar5 = RecyclableObject::IsExternal(pRVar7), BVar5 == 0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                           ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                           "GetTypeId aValue has invalid TypeId");
        if (!bVar3) goto LAB_00aa24d0;
        *puVar8 = 0;
      }
    }
    pvVar2 = local_40;
    if (3 < TVar10 - TypeIds_FirstNumberType) {
      uVar9 = 0;
      HVar4 = (HRESULT)var;
      DVar12 = var._7_1_;
      goto LAB_00aa2490;
    }
    uVar11 = (ulong)local_40 & 0xffff000000000000;
    if (((ulong)local_40 & 0x1ffff00000000) != 0x1000000000000 && uVar11 == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                         ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                         "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar3) {
LAB_00aa24d0:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar8 = 0;
    }
    DVar12 = var._7_1_;
    if (uVar11 == 0x1000000000000) {
      value = (double)(int)pvVar2;
    }
    else if ((ulong)pvVar2 >> 0x32 == 0) {
      value = JavascriptConversion::ToNumber_Full(pvVar2,scriptContext);
    }
    else {
      value = (double)((ulong)pvVar2 ^ 0xfffc000000000000);
    }
    bVar3 = NumberUtilities::IsNan(value);
    HVar4 = (HRESULT)var;
    if (!bVar3) {
      bVar3 = NumberUtilities::IsFinite(value);
      uVar9 = 0xffffffffffffffff;
      if (bVar3) {
        uVar6 = JavascriptConversion::ToUInt32(local_40,scriptContext);
        uVar9 = (uint64)uVar6;
      }
      goto LAB_00aa2490;
    }
  }
  uVar9 = 0;
LAB_00aa2490:
  if (HVar4 == -0x7ff5ffe4) {
    scriptContext->threadContext->disableImplicitFlags = DVar12;
  }
  return uVar9;
}

Assistant:

uint64 JavascriptExceptionOperators::GetStackTraceLimit(Var thrownObject, ScriptContext* scriptContext)
    {
        uint64 limit = 0;

        if (scriptContext->GetConfig()->IsErrorStackTraceEnabled()
            && IsErrorInstance(thrownObject))
        {
            HRESULT hr = JavascriptError::GetRuntimeError(VarTo<RecyclableObject>(thrownObject), NULL);
            JavascriptFunction* error = scriptContext->GetLibrary()->GetErrorConstructor();

            // If we are throwing StackOverflow and Error.stackTraceLimit is a custom getter, we can't make the getter
            // call as we don't have stack space. Just bail out without stack trace in such case. Only proceed to get
            // Error.stackTraceLimit property if we are not throwing StackOverflow, or there is no implicitCall (in getter case).
            DisableImplicitFlags disableImplicitFlags = scriptContext->GetThreadContext()->GetDisableImplicitFlags();
            if (hr == VBSERR_OutOfStack)
            {
                scriptContext->GetThreadContext()->SetDisableImplicitFlags(DisableImplicitCallAndExceptionFlag);
            }

            Var var = nullptr;
            if (JavascriptOperators::GetPropertyNoCache(error, PropertyIds::stackTraceLimit, &var, scriptContext))
            {
                // Only accept the value if it is a "Number". Avoid potential valueOf() call.
                switch (JavascriptOperators::GetTypeId(var))
                {
                case TypeIds_Integer:
                case TypeIds_Number:
                case TypeIds_Int64Number:
                case TypeIds_UInt64Number:
                    double value = JavascriptConversion::ToNumber(var, scriptContext);
                    limit = JavascriptNumber::IsNan(value) ? 0 :
                        (NumberUtilities::IsFinite(value) ? JavascriptConversion::ToUInt32(var, scriptContext) : MaxStackTraceLimit);
                    break;
                }
            }
            if (hr == VBSERR_OutOfStack)
            {
                scriptContext->GetThreadContext()->SetDisableImplicitFlags(disableImplicitFlags);
            }
    }

        return limit;
    }